

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_1;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_3;
  SyntaxNode *args_4;
  BinaryExpressionSyntax *pBVar1;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor local_31;
  Token local_30;
  
  args_1 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x18),(DeepCloneVisitor *)&local_30,
                      (BumpAllocator *)__child_stack);
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x20),(BumpAllocator *)__child_stack);
  args_3 = deepClone<slang::syntax::AttributeInstanceSyntax>
                     ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x30),
                      (BumpAllocator *)__child_stack);
  args_4 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x68),&local_31,(BumpAllocator *)__child_stack);
  pBVar1 = BumpAllocator::
           emplace<slang::syntax::BinaryExpressionSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::ExpressionSyntax&>
                     ((BumpAllocator *)__child_stack,(SyntaxKind *)__fn,(ExpressionSyntax *)args_1,
                      &local_30,args_3,(ExpressionSyntax *)args_4);
  return (int)pBVar1;
}

Assistant:

static SyntaxNode* clone(const BinaryExpressionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<BinaryExpressionSyntax>(
        node.kind,
        *deepClone<ExpressionSyntax>(*node.left, alloc),
        node.operatorToken.deepClone(alloc),
        *deepClone(node.attributes, alloc),
        *deepClone<ExpressionSyntax>(*node.right, alloc)
    );
}